

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O3

_Bool file_exists(char *path)

{
  int iVar1;
  
  iVar1 = access(path,0);
  return iVar1 == 0;
}

Assistant:

bool file_exists (const char *path) {
    #ifdef WIN32
    if (GetFileAttributesA(path) != INVALID_FILE_ATTRIBUTES) return true;
    #else
    if (access(path, F_OK) == 0) return true;
    #endif
    
    return false;
}